

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O1

void __thiscall license::test::volid_lic_file::test_method(volid_lic_file *this)

{
  FUNCTION_RETURN FVar1;
  log_level lVar2;
  vector<DiskInfo,_std::allocator<DiskInfo>_> diskInfos;
  HwIdentifier identifier_out;
  unit_test_log_t local_79;
  vector<DiskInfo,_std::allocator<DiskInfo>_> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  char *local_40;
  HwIdentifier local_38;
  begin local_28;
  
  hw_identifier::HwIdentifier::HwIdentifier(&local_38);
  local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FVar1 = getDiskInfos(&local_78);
  if (((FVar1 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar1 == FUNC_RET_OK)) &&
     (local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"volid_lic_file","");
    generate_and_verify_license(STRATEGY_DISK,(string *)local_58);
    if ((undefined1 **)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  else {
    local_28.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
    ;
    local_28.m_file_name.m_end = "";
    local_28.m_line_num = 0x39;
    lVar2 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28);
    boost::unit_test::unit_test_log_t::operator()(&local_79,lVar2);
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_0056b678;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = "No disk found skipping testing disk hardware identifier";
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_79,(lazy_ostream *)local_58);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_79);
  }
  if (local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  hw_identifier::HwIdentifier::~HwIdentifier(&local_38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(volid_lic_file) {
	HwIdentifier identifier_out;
	vector<DiskInfo> diskInfos;
	FUNCTION_RETURN result_diskinfos = getDiskInfos(diskInfos);
	if ((result_diskinfos == FUNC_RET_BUFFER_TOO_SMALL || result_diskinfos == FUNC_RET_OK) && diskInfos.size() > 0) {
		generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_DISK, "volid_lic_file");
	} else {
		BOOST_TEST_MESSAGE("No disk found skipping testing disk hardware identifier");
	}
}